

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void onlyRightProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *rightOperand)

{
  iterator iVar1;
  CTemp rightTemp;
  string rightName;
  string local_90;
  string local_70;
  string local_50;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_50,rightOperand);
  IRT::CTemp::ToString_abi_cxx11_(&local_90,rightOperand);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&spilledToOffset->_M_t,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((_Rb_tree_header *)iVar1._M_node != &(spilledToOffset->_M_t)._M_impl.super__Rb_tree_header) {
    IRT::CTemp::CTemp((CTemp *)&local_90);
    createLoad((CTemp *)&local_70,(int)&local_90,(CTemp *)(ulong)iVar1._M_node[2]._M_color);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
    ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
              ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                *)newAssemblyCommands,(shared_ptr<AssemblyCode::AssemblyCommand> *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
    IRT::CTemp::ToString_abi_cxx11_(&local_70,(CTemp *)&local_90);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::push_back(newAssemblyCommands,thisShared);
  IRT::CTemp::setName(rightOperand,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void onlyRightProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& rightOperand) {

    std::string rightName = rightOperand.ToString();

    auto rightFind = spilledToOffset.find(rightOperand.ToString());

    if (rightFind != spilledToOffset.end()) {
        IRT::CTemp rightTemp;
        newAssemblyCommands.push_back(createLoad(rightTemp, rightFind->second, beginSP));

        rightName = rightTemp.ToString();
    }

    newAssemblyCommands.push_back(thisShared);

    rightOperand.setName(rightName);
}